

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O2

void Amap_LibFree(Amap_Lib_t *p)

{
  Vec_Int_t *__ptr;
  
  if (p != (Amap_Lib_t *)0x0) {
    if (p->vSelect != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p->vSelect);
    }
    if (p->vSorted != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p->vSorted);
    }
    if (p->vGates != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p->vGates);
    }
    if ((Vec_Vec_t *)p->vRules != (Vec_Vec_t *)0x0) {
      Vec_VecFree((Vec_Vec_t *)p->vRules);
    }
    if ((Vec_Vec_t *)p->vRulesX != (Vec_Vec_t *)0x0) {
      Vec_VecFree((Vec_Vec_t *)p->vRulesX);
    }
    __ptr = p->vRules3;
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      free(__ptr);
    }
    Aig_MmFlexStop(p->pMemGates,0);
    Aig_MmFlexStop(p->pMemSet,0);
    if (p->pRules != (int **)0x0) {
      free(p->pRules);
      p->pRules = (int **)0x0;
    }
    if (p->pRulesX != (int **)0x0) {
      free(p->pRulesX);
      p->pRulesX = (int **)0x0;
    }
    if (p->pNodes != (Amap_Nod_t *)0x0) {
      free(p->pNodes);
      p->pNodes = (Amap_Nod_t *)0x0;
    }
    free(p->pName);
    free(p);
    return;
  }
  return;
}

Assistant:

void Amap_LibFree( Amap_Lib_t * p )
{
    if ( p == NULL )
        return;
    if ( p->vSelect )
        Vec_PtrFree( p->vSelect );
    if ( p->vSorted )
        Vec_PtrFree( p->vSorted );
    if ( p->vGates )
        Vec_PtrFree( p->vGates );
    if ( p->vRules )
        Vec_VecFree( (Vec_Vec_t *)p->vRules );
    if ( p->vRulesX )
        Vec_VecFree( (Vec_Vec_t *)p->vRulesX );
    if ( p->vRules3 )
        Vec_IntFree( p->vRules3 );
    Aig_MmFlexStop( p->pMemGates, 0 );
    Aig_MmFlexStop( p->pMemSet, 0 );
    ABC_FREE( p->pRules );
    ABC_FREE( p->pRulesX );
    ABC_FREE( p->pNodes );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}